

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaders.cpp
# Opt level: O0

void __thiscall fw::ShaderProgram::ShaderProgram(ShaderProgram *this,string *fileName)

{
  GLuint GVar1;
  string *fileName_local;
  ShaderProgram *this_local;
  
  GVar1 = (*glad_glCreateProgram)();
  this->_program = GVar1;
  return;
}

Assistant:

ShaderProgram::ShaderProgram(const std::string& fileName)
{
    _program = glCreateProgram();
    /*
    Shader vs, fs;

    LOG(DEBUG) << "Loading Shabui file: \"" << fileName << "\"";

    sb::GLSLLoaderFileDependencyResolver dependencyResolver{fileName};
    sb::GLSLLoader loader{dependencyResolver};
    auto code = loader.loadFile(fileName);

    if (code.vertexShaderCode != "")
    {
        vs.addSource(code.vertexShaderCode);
        vs.compile(GL_VERTEX_SHADER);
        attach(&vs);
    }

    if (code.fragmentShaderCode != "")
    {
        fs.addSource(code.fragmentShaderCode);
        fs.compile(GL_FRAGMENT_SHADER);
        attach(&fs);
    }

    link();
    */
}